

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

LRNLayerParams * __thiscall
CoreML::Specification::LRNLayerParams::New(LRNLayerParams *this,Arena *arena)

{
  LRNLayerParams *this_00;
  
  this_00 = (LRNLayerParams *)operator_new(0x28);
  LRNLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::LRNLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

LRNLayerParams* LRNLayerParams::New(::google::protobuf::Arena* arena) const {
  LRNLayerParams* n = new LRNLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}